

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

bool __thiscall InsertProxyModelPrivate::commitToSource(InsertProxyModelPrivate *this,bool isRow)

{
  QModelIndex *this_00;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  reference this_01;
  iterator it;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong i;
  size_t asize;
  QModelIndex *pQVar11;
  QVector<int> aggregateRoles;
  QModelIndex proxyIdx;
  QModelIndex currentIdx;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this_00 = (QModelIndex *)this->q_ptr;
  lVar5 = QAbstractProxyModel::sourceModel();
  if ((lVar5 != 0) &&
     ((uVar3 = (this->m_insertDirection).i, ((byte)uVar3 & isRow) != 0 ||
      ((uVar3 & 2) != 0 && !isRow)))) {
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    currentIdx.r = -1;
    currentIdx.c = -1;
    currentIdx.i = 0;
    currentIdx.m = (QAbstractItemModel *)0x0;
    uVar3 = (**(code **)(*plVar6 + 0x80))(plVar6,&currentIdx);
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    currentIdx.r = -1;
    currentIdx.c = -1;
    currentIdx.i = 0;
    currentIdx.m = (QAbstractItemModel *)0x0;
    uVar4 = (**(code **)(*plVar6 + 0x78))(plVar6,&currentIdx);
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    if (isRow) {
      currentIdx.r = -1;
      currentIdx.c = -1;
      currentIdx.i = 0;
      currentIdx.m = (QAbstractItemModel *)0x0;
      cVar2 = (**(code **)(*plVar6 + 0xf8))(plVar6,uVar4,1);
      uVar7 = uVar3;
    }
    else {
      aggregateRoles.d.d = (Data *)0xffffffffffffffff;
      aggregateRoles.d.ptr = (int *)0x0;
      aggregateRoles.d.size = 0;
      cVar2 = (**(code **)(*plVar6 + 0x100))(plVar6,uVar3,1);
      uVar7 = uVar4;
    }
    if (cVar2 != '\0') {
      i = 0;
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar8 = i;
      }
      do {
        if (i == uVar8) {
          return true;
        }
        this_01 = QList<QMap<int,_QVariant>_>::operator[](this->m_extraData + isRow,i);
        pQVar1 = (this_01->d).d;
        if ((pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0x0) &&
           ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          plVar6 = (long *)QAbstractProxyModel::sourceModel();
          if (isRow) {
            aggregateRoles.d.d = (Data *)0xffffffffffffffff;
            aggregateRoles.d.ptr = (int *)0x0;
            aggregateRoles.d.size = 0;
            lVar5 = *plVar6;
            uVar10 = (ulong)uVar4;
            uVar9 = i & 0xffffffff;
            pQVar11 = (QModelIndex *)&aggregateRoles;
          }
          else {
            proxyIdx.r = -1;
            proxyIdx.c = -1;
            proxyIdx.i = 0;
            proxyIdx.m = (QAbstractItemModel *)0x0;
            lVar5 = *plVar6;
            uVar10 = i & 0xffffffff;
            uVar9 = (ulong)uVar3;
            pQVar11 = &proxyIdx;
          }
          (**(code **)(lVar5 + 0x60))(&currentIdx,plVar6,uVar10,uVar9,pQVar11);
          plVar6 = (long *)QAbstractProxyModel::sourceModel();
          cVar2 = (**(code **)(*plVar6 + 0xb8))(plVar6,&currentIdx,this_01);
          if (cVar2 == '\0') {
            return false;
          }
          aggregateRoles.d.size = 0;
          aggregateRoles.d.d = (Data *)0x0;
          aggregateRoles.d.ptr = (int *)0x0;
          pQVar1 = (this_01->d).d;
          if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            asize = 0;
          }
          else {
            asize = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
          QList<int>::reserve((QList<int> *)&aggregateRoles,asize);
          it._M_node = (_Base_ptr)QMap<int,_QVariant>::begin(this_01);
          while ((pQVar1 = (this_01->d).d,
                 pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                            *)0x0 &&
                 ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))) {
            QList<int>::append((QList<int> *)&aggregateRoles,it._M_node[1]._M_color);
            it._M_node = (_Base_ptr)QMap<int,_QVariant>::erase(this_01,it._M_node);
          }
          if (isRow) {
            local_48 = 0xffffffffffffffff;
            local_40 = 0;
            uStack_38 = 0;
            (**(code **)(*(long *)this_00 + 0x60))
                      (&proxyIdx,this_00,uVar4 + 1,i & 0xffffffff,&local_48);
          }
          else {
            local_60 = 0xffffffffffffffff;
            local_58 = 0;
            uStack_50 = 0;
            (**(code **)(*(long *)this_00 + 0x60))
                      (&proxyIdx,this_00,i & 0xffffffff,uVar3 + 1,&local_60);
          }
          QAbstractItemModel::dataChanged(this_00,&proxyIdx,(QList_conflict *)&proxyIdx);
          InsertProxyModel::extraDataChanged
                    ((InsertProxyModel *)this_00,&proxyIdx,&proxyIdx,&aggregateRoles);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&aggregateRoles);
        }
        i = i + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool InsertProxyModelPrivate::commitToSource(const bool isRow)
{
    Q_Q(InsertProxyModel);
    if (!q->sourceModel())
        return false;
    const bool canInsCol = m_insertDirection & InsertProxyModel::InsertColumn;
    const bool canInsRow = m_insertDirection & InsertProxyModel::InsertRow;
    if (!((isRow && canInsRow) || (!isRow && canInsCol)))
        return false;
    const int sourceCols = q->sourceModel()->columnCount();
    const int sourceRows = q->sourceModel()->rowCount();
    if (!(isRow ? q->sourceModel()->insertRow(sourceRows) : q->sourceModel()->insertColumn(sourceCols)))
        return false;
    const int loopEnd = isRow ? sourceCols : sourceRows;
    for (int i = 0; i < loopEnd; ++i) {
        RolesContainer &allRoles = m_extraData[isRow][i];
        if (allRoles.isEmpty())
            continue;
        const QModelIndex currentIdx = isRow ? q->sourceModel()->index(sourceRows, i) : q->sourceModel()->index(i, sourceCols);
        Q_ASSERT(m_separateEditDisplay || (allRoles.contains(Qt::DisplayRole) == allRoles.contains(Qt::EditRole)));
        Q_ASSERT(m_separateEditDisplay || (allRoles.value(Qt::DisplayRole) == allRoles.value(Qt::EditRole)));
        if (!q->sourceModel()->setItemData(currentIdx, convertFromContainer<QMap<int, QVariant>>(allRoles)))
            return false;
        QVector<int> aggregateRoles;
        aggregateRoles.reserve(allRoles.size());
        for (auto j = allRoles.begin(); !allRoles.isEmpty(); j = allRoles.erase(j))
            aggregateRoles << j.key();
        const QModelIndex proxyIdx = isRow ? q->index(sourceRows + 1, i) : q->index(i, sourceCols + 1);
        Q_EMIT q->dataChanged(proxyIdx, proxyIdx, aggregateRoles);
        Q_EMIT q->extraDataChanged(proxyIdx, proxyIdx, aggregateRoles);
    }
    return true;
}